

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.cpp
# Opt level: O0

int rsa_verify_wrap(mbedtls_pk_context *pk,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,
                   uchar *sig,size_t sig_len)

{
  size_t sVar1;
  ulong in_RCX;
  int in_ESI;
  long in_RDI;
  ulong in_R9;
  size_t rsa_len;
  mbedtls_rsa_context *rsa;
  int ret;
  uchar *in_stack_ffffffffffffffa8;
  mbedtls_rsa_context *ctx;
  undefined4 local_4;
  
  ctx = *(mbedtls_rsa_context **)(in_RDI + 8);
  sVar1 = mbedtls_rsa_get_len(ctx);
  if ((in_ESI == 0) && (0xffffffff < in_RCX)) {
    local_4 = -16000;
  }
  else if (in_R9 < sVar1) {
    local_4 = -0x4380;
  }
  else {
    local_4 = mbedtls_rsa_pkcs1_verify
                        (ctx,(mbedtls_md_type_t)(sVar1 >> 0x20),(uint)sVar1,
                         in_stack_ffffffffffffffa8,(uchar *)0x87e3c8);
    if (local_4 == 0) {
      if (sVar1 < in_R9) {
        local_4 = -0x3900;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int rsa_verify_wrap(mbedtls_pk_context *pk, mbedtls_md_type_t md_alg,
                           const unsigned char *hash, size_t hash_len,
                           const unsigned char *sig, size_t sig_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_rsa_context *rsa = (mbedtls_rsa_context *) pk->pk_ctx;
    size_t rsa_len = mbedtls_rsa_get_len(rsa);

#if SIZE_MAX > UINT_MAX
    if (md_alg == MBEDTLS_MD_NONE && UINT_MAX < hash_len) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }
#endif

    if (sig_len < rsa_len) {
        return MBEDTLS_ERR_RSA_VERIFY_FAILED;
    }

    if ((ret = mbedtls_rsa_pkcs1_verify(rsa, md_alg,
                                        (unsigned int) hash_len,
                                        hash, sig)) != 0) {
        return ret;
    }

    /* The buffer contains a valid signature followed by extra data.
     * We have a special error code for that so that so that callers can
     * use mbedtls_pk_verify() to check "Does the buffer start with a
     * valid signature?" and not just "Does the buffer contain a valid
     * signature?". */
    if (sig_len > rsa_len) {
        return MBEDTLS_ERR_PK_SIG_LEN_MISMATCH;
    }

    return 0;
}